

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O3

ostream * plot::detail::
          output_hbox_line<std::tuple<plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>,std::tuple<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>,0ul>
                    (ostream *stream,int param_2,value_type *lines,long ends,long blocks)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  
  bVar2 = vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::equal((vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                   *)(lines + 1),
                  (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                   *)(ends + 0x30));
  if (bVar2) {
    lVar1 = *(long *)(*(long *)(blocks + 0x230) + 0x18);
    lVar3 = *(long *)(*(long *)(blocks + 0x168) + 0x18);
    if (lVar3 < lVar1) {
      lVar3 = lVar1;
    }
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = (long)((int)lVar3 + 2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"",0);
  }
  else {
    stream = operator<<(stream,(vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                                *)(lines + 1));
  }
  if (((lines->line_).line_.it_._M_current == *(block_t **)(ends + 0x18)) &&
     (lines->overflow_ == *(long *)(ends + 8))) {
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) =
         (long)(*(int *)(*(long *)(blocks + 0x98) + 0x18) + param_2 + 2);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"",0);
    return stream;
  }
  *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = (long)param_2;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"",0);
  poVar4 = operator<<(stream,lines);
  return poVar4;
}

Assistant:

inline std::ostream& output_hbox_line(std::ostream& stream,
                                          std::size_t margin,
                                          Iterators const& lines,
                                          Iterators const& ends,
                                          Blocks const& blocks,
                                          std::index_sequence<N...>) {
        return output_hbox_line(
            ((std::get<0>(lines) != std::get<0>(ends))
                ? stream << *std::get<0>(lines)
                : stream << std::setw(detail::block_traits<std::decay_t<std::tuple_element_t<0, Blocks>>>
                    ::size(std::get<0>(blocks)).x) << u8""),
            margin, std::forward_as_tuple(std::get<N+1>(lines), std::get<N+1>(ends), std::get<N+1>(blocks))...);
    }